

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall protozero::TypedProtoDecoderBase::ExpandHeapStorage(TypedProtoDecoderBase *this)

{
  uint uVar1;
  uint uVar2;
  Field *pFVar3;
  Field *__dest;
  uint uVar4;
  
  uVar1 = this->num_fields_;
  uVar2 = this->size_;
  uVar4 = this->capacity_ * 2;
  if (uVar4 <= uVar1 + 0x800) {
    uVar4 = uVar1 + 0x800;
  }
  if ((uVar2 < uVar4) && (uVar1 < uVar4)) {
    __dest = (Field *)operator_new__((ulong)uVar4 << 4);
    if (uVar1 < uVar2) {
      uVar1 = uVar2;
    }
    memset(__dest + uVar2,0,(ulong)(uVar1 - uVar2) << 4);
    memcpy(__dest,this->fields_,(ulong)uVar2 * 0x10);
    pFVar3 = (this->heap_storage_)._M_t.
             super___uniq_ptr_impl<protozero::Field,_std::default_delete<protozero::Field[]>_>._M_t.
             super__Tuple_impl<0UL,_protozero::Field_*,_std::default_delete<protozero::Field[]>_>.
             super__Head_base<0UL,_protozero::Field_*,_false>._M_head_impl;
    (this->heap_storage_)._M_t.
    super___uniq_ptr_impl<protozero::Field,_std::default_delete<protozero::Field[]>_>._M_t.
    super__Tuple_impl<0UL,_protozero::Field_*,_std::default_delete<protozero::Field[]>_>.
    super__Head_base<0UL,_protozero::Field_*,_false>._M_head_impl = __dest;
    if (pFVar3 != (Field *)0x0) {
      operator_delete__(pFVar3);
      __dest = (this->heap_storage_)._M_t.
               super___uniq_ptr_impl<protozero::Field,_std::default_delete<protozero::Field[]>_>.
               _M_t.
               super__Tuple_impl<0UL,_protozero::Field_*,_std::default_delete<protozero::Field[]>_>.
               super__Head_base<0UL,_protozero::Field_*,_false>._M_head_impl;
    }
    this->fields_ = __dest;
    this->capacity_ = uVar4;
    this->size_ = uVar1;
    return;
  }
  ExpandHeapStorage();
  (this->super_ProtoDecoder).begin_ = (uint8_t *)0x0;
  (this->super_ProtoDecoder).end_ = (uint8_t *)0x0;
  (this->super_ProtoDecoder).read_ptr_ = (uint8_t *)0x0;
  return;
}

Assistant:

void TypedProtoDecoderBase::ExpandHeapStorage() {
  // When we expand the heap we must ensure that we have at very last capacity
  // to deal with all known fields plus at least one repeated field. We go +2048
  // here based on observations on a large 4GB android trace. This is to avoid
  // trivial re-allocations when dealing with repeated fields of a message that
  // has > INITIAL_STACK_CAPACITY fields.
  const uint32_t min_capacity = num_fields_ + 2048;  // Any num >= +1 will do.
  const uint32_t new_capacity = std::max(capacity_ * 2, min_capacity);
  PERFETTO_CHECK(new_capacity > size_ && new_capacity > num_fields_);
  std::unique_ptr<Field[]> new_storage(new Field[new_capacity]);

  static_assert(std::is_trivially_constructible<Field>::value,
                "Field must be trivially constructible");
  static_assert(std::is_trivially_copyable<Field>::value,
                "Field must be trivially copyable");

  // Zero-initialize the slots for known field IDs slots, as they can be
  // randomly accessed. Instead, there is no need to initialize the repeated
  // slots, because they are written linearly with no gaps and are always
  // initialized before incrementing |size_|.
  const uint32_t new_size = std::max(size_, num_fields_);
  memset(&new_storage[size_], 0, sizeof(Field) * (new_size - size_));

  memcpy(&new_storage[0], fields_, sizeof(Field) * size_);

  heap_storage_ = std::move(new_storage);
  fields_ = &heap_storage_[0];
  capacity_ = new_capacity;
  size_ = new_size;
}